

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Expression * __thiscall soul::heart::Parser::parseExpression(Parser *this,FunctionParseState *state)

{
  ProgramImpl *pPVar1;
  bool bVar2;
  BinaryOperator *pBVar3;
  UnaryOperator *pUVar4;
  Variable *lhs;
  Expression *pEVar5;
  TypeCast *lhs_00;
  Constant *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  Op OStack_100;
  string name;
  pool_ptr<soul::heart::Variable> v;
  CodeLocation errorPos;
  Value local_98;
  CompileMessage local_58;
  
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"add");
  if (bVar2) {
    OStack_100 = add;
LAB_00250c4d:
    pBVar3 = parseBinaryOp(this,state,OStack_100);
    return &pBVar3->super_Expression;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"subtract");
  if (bVar2) {
    OStack_100 = subtract;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"multiply");
  if (bVar2) {
    OStack_100 = multiply;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"divide");
  if (bVar2) {
    OStack_100 = divide;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"modulo");
  if (bVar2) {
    OStack_100 = modulo;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"bitwiseOr");
  if (bVar2) {
    OStack_100 = bitwiseOr;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"bitwiseAnd");
  if (bVar2) {
    OStack_100 = bitwiseAnd;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"bitwiseXor");
  if (bVar2) {
    OStack_100 = bitwiseXor;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"logicalOr");
  if (bVar2) {
    OStack_100 = logicalOr;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"logicalAnd");
  if (bVar2) {
    OStack_100 = logicalAnd;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"equals");
  if (bVar2) {
    OStack_100 = equals;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"notEquals");
  if (bVar2) {
    OStack_100 = notEquals;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"lessThan");
  if (bVar2) {
    OStack_100 = lessThan;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"lessThanOrEqual");
  if (bVar2) {
    OStack_100 = lessThanOrEqual;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"greaterThan");
  if (bVar2) {
    OStack_100 = greaterThan;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"greaterThanOrEqual");
  if (bVar2) {
    OStack_100 = greaterThanOrEqual;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"leftShift");
  if (bVar2) {
    OStack_100 = leftShift;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"rightShift");
  if (bVar2) {
    OStack_100 = rightShift;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"rightShiftUnsigned");
  if (bVar2) {
    OStack_100 = rightShiftUnsigned;
    goto LAB_00250c4d;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"negate");
  if (bVar2) {
    OStack_100 = negate;
LAB_00250caf:
    pUVar4 = parseUnaryOp(this,state,OStack_100);
    return &pUVar4->super_Expression;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"logicalNot");
  if (bVar2) {
    OStack_100 = logicalNot;
    goto LAB_00250caf;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"bitwiseNot");
  if (bVar2) {
    OStack_100 = bitwiseNot;
    goto LAB_00250caf;
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,(TokenType)0x275b94);
  if (bVar2) {
    errorPos.sourceCode.object =
         (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.sourceCode.object;
    if (errorPos.sourceCode.object != (SourceCodeText *)0x0) {
      ((errorPos.sourceCode.object)->super_RefCountedObject).refCount =
           ((errorPos.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    errorPos.location.data =
         (this->
         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
         ).location.location.data;
    readQualifiedVariableIdentifier_abi_cxx11_(&name,this);
    findVariable((Parser *)&v,(FunctionParseState *)this,(string *)state);
    if (v.object != (Variable *)0x0) {
      lhs = pool_ptr<soul::heart::Variable>::operator*(&v);
      pEVar5 = parseSuffixOperators(this,state,&lhs->super_Expression);
      std::__cxx11::string::~string((string *)&name);
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&errorPos.sourceCode);
      return pEVar5;
    }
    Errors::unresolvedSymbol<std::__cxx11::string&>(&local_58,(Errors *)&name,args);
    CodeLocation::throwError(&errorPos,&local_58);
  }
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,(TokenType)0x275bb9);
  if (!bVar2) goto LAB_00250e1f;
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
          ::matchIf<char_const*>
                    ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                      *)this,"cast");
  if (bVar2) {
    lhs_00 = parseCast(this,state);
    pEVar5 = parseSuffixOperators(this,state,&lhs_00->super_Expression);
    return pEVar5;
  }
  __return_storage_ptr__ = (Constant *)&name;
  parseNaNandInfinityTokens((Value *)__return_storage_ptr__,this);
  if ((char)name._M_dataplus._M_p == '\0') {
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
            ::matchIf<char_const*>
                      ((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                        *)this,"processor");
    if (bVar2) {
      __return_storage_ptr__ = (Constant *)parseProcessorProperty(this);
      goto LAB_00250e0a;
    }
    bVar2 = true;
  }
  else {
    pPVar1 = (this->program).pimpl;
    soul::Value::Value(&local_98,(Value *)&name);
    __return_storage_ptr__ = Allocator::allocateConstant(&pPVar1->allocator,&local_98);
    soul::Value::~Value(&local_98);
LAB_00250e0a:
    bVar2 = false;
  }
  soul::Value::~Value((Value *)&name);
  if (!bVar2) {
    return &__return_storage_ptr__->super_Expression;
  }
LAB_00250e1f:
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matches(&this->
                     super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ,(TokenType)0x275cde);
  if (bVar2) {
    name._M_dataplus._M_p._0_1_ = '\x01';
    name._M_dataplus._M_p._1_7_ = 0x7000000;
    name._M_string_length._0_1_ = 0;
    name._M_string_length._1_7_ = 0;
    name.field_2._M_local_buf[0] = '\0';
    name.field_2._M_allocated_capacity._1_7_ = 0;
    pEVar5 = parseConstantAsExpression(this,state,(Type *)&name);
  }
  else {
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matches(&this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                      ,(TokenType)0x275ce9);
    if (bVar2) {
      name._M_dataplus._M_p._0_1_ = '\x01';
      name._M_dataplus._M_p._1_7_ = 0x8000000;
      name._M_string_length._0_1_ = 0;
      name._M_string_length._1_7_ = 0;
      name.field_2._M_local_buf[0] = '\0';
      name.field_2._M_allocated_capacity._1_7_ = 0;
      pEVar5 = parseConstantAsExpression(this,state,(Type *)&name);
    }
    else {
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matches(&this->
                         super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                        ,(TokenType)0x275d8c);
      if (bVar2) {
        name._M_dataplus._M_p._0_1_ = '\x01';
        name._M_dataplus._M_p._1_7_ = 0x2000000;
        name._M_string_length._0_1_ = 0;
        name._M_string_length._1_7_ = 0;
        name.field_2._M_local_buf[0] = '\0';
        name.field_2._M_allocated_capacity._1_7_ = 0;
        pEVar5 = parseConstantAsExpression(this,state,(Type *)&name);
      }
      else {
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matches(&this->
                           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                          ,(TokenType)0x275d83);
        if (bVar2) {
          name._M_dataplus._M_p._0_1_ = '\x01';
          name._M_dataplus._M_p._1_7_ = 0x3000000;
          name._M_string_length._0_1_ = 0;
          name._M_string_length._1_7_ = 0;
          name.field_2._M_local_buf[0] = '\0';
          name.field_2._M_allocated_capacity._1_7_ = 0;
          pEVar5 = parseConstantAsExpression(this,state,(Type *)&name);
        }
        else {
          bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ::matches(&this->
                             super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                            ,(TokenType)0x275d47);
          if (bVar2) {
            name._M_dataplus._M_p._0_1_ = '\a';
            name._M_dataplus._M_p._1_7_ = 0;
            name._M_string_length._0_1_ = 0;
            name._M_string_length._1_7_ = 0;
            name.field_2._M_local_buf[0] = '\0';
            name.field_2._M_allocated_capacity._1_7_ = 0;
            pEVar5 = parseConstantAsExpression(this,state,(Type *)&name);
          }
          else {
            readValueType((Type *)&name,this);
            pEVar5 = parseConstantAsExpression(this,state,(Type *)&name);
          }
        }
      }
    }
  }
  RefCountedPtr<soul::Structure>::~RefCountedPtr
            ((RefCountedPtr<soul::Structure> *)&name.field_2._M_allocated_capacity);
  return pEVar5;
}

Assistant:

heart::Expression& parseExpression (const FunctionParseState& state)
    {
        #define SOUL_MATCH_BINARY_OP_NAME(name, op) \
            if (matchIf (#name)) return parseBinaryOp (state, BinaryOp::Op::name);
        SOUL_BINARY_OPS (SOUL_MATCH_BINARY_OP_NAME)
        #undef SOUL_MATCH_BINARY_OP_NAME

        #define SOUL_COMPARE_UNARY_OP(name, op) \
            if (matchIf (#name)) return parseUnaryOp (state, UnaryOp::Op::name);
        SOUL_UNARY_OPS (SOUL_COMPARE_UNARY_OP)
        #undef SOUL_COMPARE_UNARY_OP

        if (matches (Token::variableIdentifier))
        {
            auto errorPos = location;
            auto name = readQualifiedVariableIdentifier();

            if (auto v = findVariable (state, name))
                return parseSuffixOperators (state, *v);

            errorPos.throwError (Errors::unresolvedSymbol (name));
        }

        if (matches (Token::identifier))
        {
            if (matchIf ("cast"))
                return parseSuffixOperators (state, parseCast (state));

            auto infOrNaN = parseNaNandInfinityTokens();

            if (infOrNaN.isValid())
                return program.getAllocator().allocateConstant (infOrNaN);

            if (matchIf ("processor"))
                return parseProcessorProperty();
        }

        if (matches (Token::literalInt32))       return parseConstantAsExpression (state, PrimitiveType::int32);
        if (matches (Token::literalInt64))       return parseConstantAsExpression (state, PrimitiveType::int64);
        if (matches (Token::literalFloat32))     return parseConstantAsExpression (state, PrimitiveType::float32);
        if (matches (Token::literalFloat64))     return parseConstantAsExpression (state, PrimitiveType::float64);
        if (matches (Token::literalString))      return parseConstantAsExpression (state, Type::createStringLiteral());

        return parseConstantAsExpression (state, readValueType());
    }